

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::benchmarkEnded(ConsoleReporter *this,BenchmarkStats *stats)

{
  ulong uVar1;
  TablePrinter *pTVar2;
  ostream *poVar3;
  char *pcVar4;
  int iVar5;
  double dVar6;
  undefined1 auVar7 [16];
  allocator local_41;
  string local_40 [32];
  
  uVar1 = stats->elapsedTimeInNanoseconds / stats->iterations;
  if (uVar1 < 1000) {
    iVar5 = 1;
  }
  else if (uVar1 < 1000000) {
    iVar5 = 2;
  }
  else if (uVar1 < 1000000000) {
    iVar5 = 3;
  }
  else {
    iVar5 = 5 - (uint)(uVar1 >> 0xb < 0x1bf08eb);
  }
  pTVar2 = Catch::operator<<((this->m_tablePrinter)._M_t.
                             super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>
                             .super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl,
                             &stats->iterations);
  Catch::operator<<(pTVar2);
  pTVar2 = Catch::operator<<(pTVar2,&stats->elapsedTimeInNanoseconds);
  Catch::operator<<(pTVar2);
  auVar7._8_4_ = (int)(uVar1 >> 0x20);
  auVar7._0_8_ = uVar1;
  auVar7._12_4_ = 0x45300000;
  dVar6 = (auVar7._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  switch(iVar5) {
  case 2:
    poVar3 = std::ostream::_M_insert<double>(dVar6 / 1000.0);
    poVar3 = std::operator<<(poVar3," ");
    pcVar4 = "us";
    break;
  case 3:
    poVar3 = std::ostream::_M_insert<double>(dVar6 / 1000000.0);
    poVar3 = std::operator<<(poVar3," ");
    pcVar4 = "ms";
    break;
  case 4:
    poVar3 = std::ostream::_M_insert<double>(dVar6 / 1000000000.0);
    poVar3 = std::operator<<(poVar3," ");
    pcVar4 = "s";
    break;
  case 5:
    poVar3 = std::ostream::_M_insert<double>(dVar6 / 60000000000.0);
    poVar3 = std::operator<<(poVar3," ");
    pcVar4 = "m";
    break;
  default:
    poVar3 = std::ostream::_M_insert<double>(dVar6);
    poVar3 = std::operator<<(poVar3," ");
    pcVar4 = "ns";
  }
  std::__cxx11::string::string(local_40,pcVar4,&local_41);
  std::operator<<(poVar3,local_40);
  std::__cxx11::string::~string(local_40);
  Catch::operator<<(pTVar2);
  return;
}

Assistant:

void ConsoleReporter::benchmarkEnded(BenchmarkStats const& stats) {
    Duration average(stats.elapsedTimeInNanoseconds / stats.iterations);
    (*m_tablePrinter)
        << stats.iterations << ColumnBreak()
        << stats.elapsedTimeInNanoseconds << ColumnBreak()
        << average << ColumnBreak();
}